

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O3

int64 __thiscall
google::protobuf::io::CodedInputStream::ReadVarint32Fallback
          (CodedInputStream *this,uint32 first_byte_or_zero)

{
  uint8 *puVar1;
  ulong uVar2;
  uint8 *puVar3;
  uint uVar4;
  int iVar5;
  pair<unsigned_long,_bool> pVar6;
  
  puVar3 = this->buffer_;
  puVar1 = this->buffer_end_;
  if (((int)puVar1 - (int)puVar3 < 10) && ((puVar1 <= puVar3 || ((char)puVar1[-1] < '\0')))) {
    pVar6 = ReadVarint64Fallback(this);
    uVar2 = 0xffffffffffffffff;
    if (((undefined1  [16])pVar6 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      uVar2 = (ulong)(uint)pVar6.first;
    }
  }
  else {
    uVar4 = ((uint)puVar3[1] * 0x80 + first_byte_or_zero) - 0x80;
    if ((char)puVar3[1] < '\0') {
      uVar4 = (uVar4 + (uint)puVar3[2] * 0x4000) - 0x4000;
      if ((char)puVar3[2] < '\0') {
        uVar4 = (uVar4 + (uint)puVar3[3] * 0x200000) - 0x200000;
        if ((char)puVar3[3] < '\0') {
          uVar4 = uVar4 + (uint)puVar3[4] * 0x10000000 + 0xf0000000;
          if ((char)puVar3[4] < '\0') {
            puVar3 = puVar3 + 6;
            iVar5 = 5;
            while ((char)puVar3[-1] < '\0') {
              puVar3 = puVar3 + 1;
              iVar5 = iVar5 + -1;
              if (iVar5 == 0) {
                return -1;
              }
            }
          }
          else {
            puVar3 = puVar3 + 5;
          }
        }
        else {
          puVar3 = puVar3 + 4;
        }
      }
      else {
        puVar3 = puVar3 + 3;
      }
    }
    else {
      puVar3 = puVar3 + 2;
    }
    this->buffer_ = puVar3;
    uVar2 = (ulong)uVar4;
  }
  return uVar2;
}

Assistant:

int64 CodedInputStream::ReadVarint32Fallback(uint32 first_byte_or_zero) {
  if (BufferSize() >= kMaxVarintBytes ||
      // Optimization:  We're also safe if the buffer is non-empty and it ends
      // with a byte that would terminate a varint.
      (buffer_end_ > buffer_ && !(buffer_end_[-1] & 0x80))) {
    GOOGLE_DCHECK_NE(first_byte_or_zero, 0)
        << "Caller should provide us with *buffer_ when buffer is non-empty";
    uint32 temp;
    ::std::pair<bool, const uint8*> p =
        ReadVarint32FromArray(first_byte_or_zero, buffer_, &temp);
    if (!p.first) return -1;
    buffer_ = p.second;
    return temp;
  } else {
    // Really slow case: we will incur the cost of an extra function call here,
    // but moving this out of line reduces the size of this function, which
    // improves the common case. In micro benchmarks, this is worth about 10-15%
    uint32 temp;
    return ReadVarint32Slow(&temp) ? static_cast<int64>(temp) : -1;
  }
}